

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cost_sensitive.cc
# Opt level: O1

void COST_SENSITIVE::print_update
               (vw *all,bool is_test,example *ec,multi_ex *ec_seq,bool action_scores,
               uint32_t prediction)

{
  pointer psVar1;
  bool holdout_set_off;
  shared_data *psVar2;
  _func_int *p_Var3;
  namedlabels *pnVar4;
  size_t current_pass;
  char cVar5;
  example **ecc;
  pointer ppeVar6;
  uint uVar7;
  char *pcVar8;
  size_t num_features;
  string label_buf;
  ostringstream pred_buf;
  string local_1e8;
  string local_1c8;
  undefined1 local_1a8 [24];
  undefined1 auStack_190 [88];
  ios_base local_138 [112];
  char acStack_c8 [152];
  
  psVar2 = all->sd;
  if ((((double)psVar2->dump_interval <=
        psVar2->weighted_labeled_examples + psVar2->weighted_unlabeled_examples) &&
      (all->quiet == false)) && (all->bfgs == false)) {
    if (ec_seq == (multi_ex *)0x0) {
      num_features = ec->num_features;
    }
    else {
      num_features = 0;
      for (ppeVar6 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                     super__Vector_impl_data._M_start;
          ppeVar6 !=
          (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
          super__Vector_impl_data._M_finish; ppeVar6 = ppeVar6 + 1) {
        num_features = num_features + (*ppeVar6)->num_features;
      }
    }
    local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
    local_1e8._M_string_length = 0;
    local_1e8.field_2._M_local_buf[0] = '\0';
    pcVar8 = " known";
    if (is_test) {
      pcVar8 = " unknown";
    }
    std::__cxx11::string::_M_replace((ulong)&local_1e8,0,(char *)0x0,(ulong)pcVar8);
    if ((action_scores) || (all->sd->ldict != (namedlabels *)0x0)) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      *(undefined8 *)(*(_func_int **)(local_1a8._0_8_ + -0x18) + (long)(local_1a8 + 0x10)) = 8;
      *(uint *)(*(_func_int **)(local_1a8._0_8_ + -0x18) + (long)(local_1a8 + 0x18)) =
           *(uint *)(*(_func_int **)(local_1a8._0_8_ + -0x18) + (long)(local_1a8 + 0x18)) &
           0xffffff4f | 0x80;
      p_Var3 = *(_func_int **)(local_1a8._0_8_ + -0x18);
      if ((acStack_c8 + 1)[(long)p_Var3] == '\0') {
        cVar5 = std::ios::widen((char)(&stack0xfffffffffffffe08 + (long)p_Var3) + 'P');
        acStack_c8[(long)p_Var3] = cVar5;
        (acStack_c8 + 1)[(long)p_Var3] = '\x01';
      }
      acStack_c8[(long)p_Var3] = ' ';
      pnVar4 = all->sd->ldict;
      if (pnVar4 == (namedlabels *)0x0) {
        std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      }
      else if (action_scores) {
        uVar7 = ((ec->pred).a_s._begin)->action - 1;
        local_1c8._M_dataplus._M_p._0_4_ = 0;
        local_1c8._M_dataplus._M_p._4_4_ = 0;
        local_1c8._M_string_length._0_4_ = 0;
        local_1c8._M_string_length._4_4_ = 0;
        if (uVar7 < pnVar4->K) {
          psVar1 = (pnVar4->id2name).super__Vector_base<substring,_std::allocator<substring>_>.
                   _M_impl.super__Vector_impl_data._M_start + uVar7;
          local_1c8._M_dataplus._M_p._0_4_ = *(undefined4 *)&psVar1->begin;
          local_1c8._M_dataplus._M_p._4_4_ = *(undefined4 *)((long)&psVar1->begin + 4);
          local_1c8._M_string_length._0_4_ = *(undefined4 *)&psVar1->end;
          local_1c8._M_string_length._4_4_ = *(undefined4 *)((long)&psVar1->end + 4);
        }
        ::operator<<((ostream *)local_1a8,(substring *)&local_1c8);
      }
      else {
        local_1c8._M_dataplus._M_p._0_4_ = 0;
        local_1c8._M_dataplus._M_p._4_4_ = 0;
        local_1c8._M_string_length._0_4_ = 0;
        local_1c8._M_string_length._4_4_ = 0;
        if (prediction - 1 < pnVar4->K) {
          psVar1 = (pnVar4->id2name).super__Vector_base<substring,_std::allocator<substring>_>.
                   _M_impl.super__Vector_impl_data._M_start + (prediction - 1);
          local_1c8._M_dataplus._M_p._0_4_ = *(undefined4 *)&psVar1->begin;
          local_1c8._M_dataplus._M_p._4_4_ = *(undefined4 *)((long)&psVar1->begin + 4);
          local_1c8._M_string_length._0_4_ = *(undefined4 *)&psVar1->end;
          local_1c8._M_string_length._4_4_ = *(undefined4 *)((long)&psVar1->end + 4);
        }
        ::operator<<((ostream *)local_1a8,(substring *)&local_1c8);
      }
      if (action_scores) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,".....",5);
      }
      psVar2 = all->sd;
      current_pass = all->current_pass;
      holdout_set_off = all->holdout_set_off;
      std::__cxx11::stringbuf::str();
      shared_data::print_update
                (psVar2,holdout_set_off,current_pass,&local_1e8,&local_1c8,num_features,
                 all->progress_add,all->progress_arg);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_1c8._M_dataplus._M_p._4_4_,local_1c8._M_dataplus._M_p._0_4_) !=
          &local_1c8.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_1c8._M_dataplus._M_p._4_4_,local_1c8._M_dataplus._M_p._0_4_))
        ;
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
    }
    else {
      shared_data::print_update
                (all->sd,all->holdout_set_off,all->current_pass,&local_1e8,prediction,num_features,
                 all->progress_add,all->progress_arg);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

void print_update(vw& all, bool is_test, example& ec, multi_ex* ec_seq, bool action_scores, uint32_t prediction)
{
  if (all.sd->weighted_examples() >= all.sd->dump_interval && !all.quiet && !all.bfgs)
  {
    size_t num_current_features = ec.num_features;
    // for csoaa_ldf we want features from the whole (multiline example),
    // not only from one line (the first one) represented by ec
    if (ec_seq != nullptr)
    {
      num_current_features = 0;
      // TODO: including quadratic and cubic.
      for (auto & ecc : *ec_seq) num_current_features += ecc->num_features;
    }

    std::string label_buf;
    if (is_test)
      label_buf = " unknown";
    else
      label_buf = " known";

    if (action_scores || all.sd->ldict)
    {
      std::ostringstream pred_buf;

      pred_buf << std::setw(all.sd->col_current_predict) << std::right << std::setfill(' ');
      if (all.sd->ldict)
      {
        if (action_scores)
          pred_buf << all.sd->ldict->get(ec.pred.a_s[0].action);
        else
          pred_buf << all.sd->ldict->get(prediction);
      }
      else
        pred_buf << ec.pred.a_s[0].action;
      if (action_scores)
        pred_buf << ".....";
      all.sd->print_update(all.holdout_set_off, all.current_pass, label_buf, pred_buf.str(), num_current_features,
          all.progress_add, all.progress_arg);
      ;
    }
    else
      all.sd->print_update(all.holdout_set_off, all.current_pass, label_buf, prediction, num_current_features,
          all.progress_add, all.progress_arg);
  }
}